

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

int FindDiffPoint(FName *name1,char *str2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_24;
  int i;
  char *str1;
  char *str2_local;
  FName *name1_local;
  
  pcVar3 = FName::GetChars(name1);
  local_24 = 0;
  while( true ) {
    iVar1 = tolower((int)pcVar3[local_24]);
    iVar2 = tolower((int)str2[local_24]);
    if (((iVar1 != iVar2) || (pcVar3[local_24] == '\0')) || (str2[local_24] == '\0')) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

static int FindDiffPoint (FName name1, const char *str2)
{
	const char *str1 = name1.GetChars();
	int i;

	for (i = 0; tolower(str1[i]) == tolower(str2[i]); i++)
		if (str1[i] == 0 || str2[i] == 0)
			break;

	return i;
}